

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O1

string * __thiscall
leveldb::ParsedInternalKey::DebugString_abi_cxx11_
          (string *__return_storage_ptr__,ParsedInternalKey *this)

{
  char *pcVar1;
  Slice *value;
  char buf [50];
  undefined1 *local_a8;
  undefined8 uStack_a0;
  undefined1 local_98 [16];
  string local_88;
  undefined1 *local_68;
  undefined8 uStack_60;
  char local_58 [56];
  
  snprintf(local_58,0x32,"\' @ %llu : %d",this->sequence,(ulong)this->type);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"\'","");
  pcVar1 = (this->user_key).data_;
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,pcVar1,pcVar1 + (this->user_key).size_);
  local_68 = local_a8;
  uStack_60 = uStack_a0;
  EscapeString_abi_cxx11_(&local_88,(leveldb *)&local_68,value);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_88._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string ParsedInternalKey::DebugString() const {
        char buf[50];
        snprintf(buf, sizeof(buf), "' @ %llu : %d",
                 (unsigned long long) sequence,
                 int(type));
        std::string result = "'";
        result += EscapeString(user_key.ToString());
        result += buf;
        return result;
    }